

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJacobiEigenSolver.cpp
# Opt level: O2

void testMinMaxEigenValue<Imath_3_2::Matrix33<float>>(Matrix33<float> *A)

{
  float *pfVar1;
  long lVar2;
  float *pfVar3;
  long lVar4;
  BaseType_conflict2 BVar5;
  TV maxV;
  TV minV;
  TV S;
  Matrix33<float> A1;
  Vec3 local_d0 [12];
  Vec3 local_c4 [12];
  undefined8 local_b8;
  float afStack_b0 [8];
  Matrix33 local_90 [36];
  Matrix33 local_6c [36];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined4 local_28;
  
  local_48 = 0x3f800000;
  uStack_40 = 0;
  local_38 = 0x3f800000;
  uStack_30 = 0;
  local_28 = 0x3f800000;
  local_b8 = 0x3f800000;
  afStack_b0[0] = 0.0;
  afStack_b0[1] = 0.0;
  afStack_b0[2] = 1.0;
  afStack_b0[3] = 0.0;
  afStack_b0[4] = 0.0;
  afStack_b0[5] = 0.0;
  afStack_b0[6] = 1.0;
  BVar5 = computeThreshold<Imath_3_2::Matrix33<float>>(A);
  Imath_3_2::Matrix33<float>::Matrix33((Matrix33<float> *)local_6c,A);
  Imath_3_2::minEigenVector<Imath_3_2::Matrix33<float>,Imath_3_2::Vec3<float>>(local_6c,local_c4);
  Imath_3_2::Matrix33<float>::Matrix33((Matrix33<float> *)local_90,A);
  Imath_3_2::maxEigenVector<Imath_3_2::Matrix33<float>,Imath_3_2::Vec3<float>>(local_90,local_d0);
  Imath_3_2::Matrix33<float>::Matrix33((Matrix33<float> *)local_6c,A);
  lVar4 = 0;
  Imath_3_2::jacobiSVD<float>
            (local_6c,(Matrix33 *)&local_48,(Vec3 *)local_90,(Matrix33 *)&local_b8,1.1920929e-07,
             false);
  pfVar3 = afStack_b0;
  while( true ) {
    if (lVar4 == 3) {
      return;
    }
    if (BVar5 <= ABS(*(float *)(local_c4 + lVar4 * 4) - *pfVar3)) break;
    lVar2 = lVar4 * 4;
    pfVar1 = pfVar3 + -2;
    lVar4 = lVar4 + 1;
    pfVar3 = pfVar3 + 3;
    if (BVar5 <= ABS(*(float *)(local_d0 + lVar2) - *pfVar1)) {
      __assert_fail("abs (maxV[i] - V[i][0]) < threshold",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testJacobiEigenSolver.cpp"
                    ,0x98,"void testMinMaxEigenValue(const TM &) [TM = Imath_3_2::Matrix33<float>]")
      ;
    }
  }
  __assert_fail("abs (minV[i] - V[i][dim - 1]) < threshold",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testJacobiEigenSolver.cpp"
                ,0x97,"void testMinMaxEigenValue(const TM &) [TM = Imath_3_2::Matrix33<float>]");
}

Assistant:

void
testMinMaxEigenValue (const TM& A)
{
    typedef typename TM::BaseVecType TV;
    typedef typename TM::BaseType    T;

    TV minV, maxV, S;
    TM U, V;

    const T threshold = computeThreshold (A);

    {
        TM A1 (A);
        minEigenVector (A1, minV);
        TM A2 (A);
        maxEigenVector (A2, maxV);
    }
    {
        TM A3 (A);
        jacobiSVD (A3, U, S, V);
    }

    const int dim = TM::dimensions ();

    for (int i = 0; i < dim; ++i)
    {
        assert (abs (minV[i] - V[i][dim - 1]) < threshold);
        assert (abs (maxV[i] - V[i][0]) < threshold);
    }
}